

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk.cpp
# Opt level: O1

bool __thiscall
phyr::Disk::intersectRay(Disk *this,Ray *r,double *t0,SurfaceInteraction *si,bool testAlpha)

{
  Transform *this_00;
  double dVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Point3f local_508;
  Ray ray;
  Point2f local_4a8;
  Vector3f local_498;
  Vector3f local_478;
  Normal3f local_458;
  Normal3f local_438;
  Vector3f local_418;
  Vector3f local_3f8;
  Vector3f dErr;
  Vector3f oErr;
  SurfaceInteraction local_398;
  SurfaceInteraction local_1e0;
  
  oErr.x = 0.0;
  oErr.y = 0.0;
  bVar2 = false;
  oErr.z = 0.0;
  dErr.z = 0.0;
  dErr.x = 0.0;
  dErr.y = 0.0;
  Transform::operator()((this->super_Shape).worldToLocal,r,&oErr,&dErr);
  if ((ray.d.z != 0.0) || (NAN(ray.d.z))) {
    dVar3 = (this->height - ray.o.z) / ray.d.z;
    bVar2 = false;
    if ((0.0 < dVar3) && (dVar3 < ray.tMax)) {
      local_508.z = ray.o.z + ray.d.z * dVar3;
      local_508.x = dVar3 * ray.d.x + ray.o.x;
      local_508.y = dVar3 * ray.d.y + ray.o.y;
      dVar5 = local_508.x * local_508.x + local_508.y * local_508.y;
      if ((this->radius * this->radius < dVar5) || (dVar5 < this->innerRadius * this->innerRadius))
      {
        bVar2 = false;
      }
      else {
        dVar1 = atan2(local_508.y,local_508.x);
        dVar6 = (double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar1 |
                        (ulong)(dVar1 + 6.283185307179586) & -(ulong)(dVar1 < 0.0));
        dVar1 = this->phiMax;
        bVar2 = dVar6 <= dVar1;
        if (dVar6 <= dVar1) {
          if (dVar5 < 0.0) {
            dVar5 = sqrt(dVar5);
          }
          else {
            dVar5 = SQRT(dVar5);
          }
          dVar4 = this->innerRadius;
          local_4a8.y = 1.0 - (dVar5 - dVar4) / (this->radius - dVar4);
          dVar4 = dVar4 - this->radius;
          local_3f8.x = local_508.y * -this->phiMax;
          local_3f8.y = local_508.x * this->phiMax;
          local_3f8.z = 0.0;
          dVar5 = 1.0 / dVar5;
          local_418.z = dVar4 * 0.0 * dVar5;
          local_418.x = dVar5 * dVar4 * local_508.x;
          local_418.y = dVar5 * dVar4 * local_508.y;
          local_438.z = 0.0;
          local_438.x = 0.0;
          local_438.y = 0.0;
          local_458.z = 0.0;
          local_458.x = 0.0;
          local_458.y = 0.0;
          local_508.z = this->height;
          local_478.z = 0.0;
          local_478.x = 0.0;
          local_478.y = 0.0;
          this_00 = (this->super_Shape).localToWorld;
          local_498.z = -ray.d.z;
          local_498.x = -ray.d.x;
          local_498.y = -ray.d.y;
          local_4a8.x = dVar6 / dVar1;
          SurfaceInteraction::SurfaceInteraction
                    (&local_398,&local_508,&local_498,&local_478,&local_4a8,&local_3f8,&local_418,
                     &local_438,&local_458,&this->super_Shape);
          Transform::operator()(&local_1e0,this_00,&local_398);
          memcpy(si,&local_1e0,0x1b8);
          *t0 = dVar3;
          bVar2 = true;
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool Disk::intersectRay(const Ray& r, Real* t0, SurfaceInteraction* si,
                        bool testAlpha) const {
    // Transform {Ray} to local space
    Vector3f oErr, dErr;
    Ray ray = (*worldToLocal)(r, &oErr, &dErr);

    // Compute plane intersection for disk

    // Reject disk intersections for rays parallel to the disk's plane
    if (ray.d.z == 0) return false;
    Real tShapeHit = (height - ray.o.z) / ray.d.z;
    if (tShapeHit <= 0 || tShapeHit >= ray.tMax) return false;

    // See if hit point is inside disk radii and {phiMax}
    Point3f pHit = ray(tShapeHit);
    Real dist2 = pHit.x * pHit.x + pHit.y * pHit.y;
    if (dist2 > radius * radius || dist2 < innerRadius * innerRadius)
        return false;

    // Test disk {phi} value against {phiMax}
    Real phi = std::atan2(pHit.y, pHit.x);
    if (phi < 0) phi += 2 * Pi;
    if (phi > phiMax) return false;

    // Find parametric representation of disk hit
    Real u = phi / phiMax;
    Real rHit = std::sqrt(dist2);
    Real oneMinusV = ((rHit - innerRadius) / (radius - innerRadius));
    Real v = 1 - oneMinusV;
    Vector3f dpdu(-phiMax * pHit.y, phiMax * pHit.x, 0);
    Vector3f dpdv = Vector3f(pHit.x, pHit.y, 0.) * (innerRadius - radius) / rHit;
    Normal3f dndu(0, 0, 0), dndv(0, 0, 0);

    // Refine disk intersection point
    pHit.z = height;

    // Compute error bounds for disk intersection
    Vector3f pError(0, 0, 0);

    // Initialize _SurfaceInteraction_ from parametric information
    *si = (*localToWorld)(SurfaceInteraction(pHit, -ray.d, pError, Point2f(u, v),
                                             dpdu, dpdv, dndu, dndv, this));

    // Update _tHit_ for quadric intersection
    *t0 = Real(tShapeHit);
    return true;
}